

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  uint uVar1;
  size_t err_code_1;
  size_t err_code;
  ZSTD_DDict *ddict_local;
  ZSTD_DStream *dctx_local;
  
  dctx_local = (ZSTD_DStream *)ZSTD_DCtx_reset(dctx,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    dctx_local = (ZSTD_DStream *)ZSTD_DCtx_refDDict(dctx,ddict);
    uVar1 = ERR_isError((size_t)dctx_local);
    if (uVar1 == 0) {
      dctx_local = (ZSTD_DStream *)ZSTD_startingInputLength(dctx->format);
    }
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_refDDict(dctx, ddict) , "");
    return ZSTD_startingInputLength(dctx->format);
}